

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.cpp
# Opt level: O2

ostream * operator<<(ostream *o,Address *a)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(o,"country: ");
  poVar1 = std::operator<<(poVar1,(string *)a);
  poVar1 = std::operator<<(poVar1,", city: ");
  poVar1 = std::operator<<(poVar1,(string *)&a->city);
  poVar1 = std::operator<<(poVar1,", street: ");
  std::operator<<(poVar1,(string *)&a->street);
  return o;
}

Assistant:

ostream& operator <<(ostream& o, const Address& a) {

    o << "country: " << a.getCountry() << ", city: " << a.getCity() << ", street: " << a.getStreet();
    return o;
}